

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyClient.cpp
# Opt level: O0

void __thiscall
ProxyClient::sendToPipe(ProxyClient *this,uint32_t sessionID,uint8_t *data,int32_t len)

{
  pointer pCVar1;
  uint local_24;
  uint8_t *puStack_20;
  int32_t len_local;
  uint8_t *data_local;
  uint32_t sessionID_local;
  ProxyClient *this_local;
  
  local_24 = len;
  puStack_20 = data;
  if (len < 1) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/ProxyClient.cpp"
                  ,0x2c7,"void ProxyClient::sendToPipe(uint32_t, uint8_t *, int32_t)");
  }
  for (; 0x578 < (int)local_24; local_24 = local_24 - 0x578) {
    pCVar1 = std::unique_ptr<net_uv::Client,_std::default_delete<net_uv::Client>_>::operator->
                       (&this->m_pipe);
    (*(pCVar1->super_SessionManager)._vptr_SessionManager[2])
              (&pCVar1->super_SessionManager,(ulong)sessionID,puStack_20,0x578);
    puStack_20 = puStack_20 + 0x578;
  }
  pCVar1 = std::unique_ptr<net_uv::Client,_std::default_delete<net_uv::Client>_>::operator->
                     (&this->m_pipe);
  (*(pCVar1->super_SessionManager)._vptr_SessionManager[2])
            (&pCVar1->super_SessionManager,(ulong)sessionID,puStack_20,(ulong)local_24);
  return;
}

Assistant:

void ProxyClient::sendToPipe(uint32_t sessionID, uint8_t* data, int32_t len)
{
	if (len <= 0)
	{
		assert(0);
		m_pipe->disconnect(sessionID);
		return;
	}

	do
	{
		if (len <= BLOCK_DATA_SIZE)
		{
			m_pipe->send(sessionID, (char*)data, len);
			break;
		}
		m_pipe->send(sessionID, (char*)data, BLOCK_DATA_SIZE);
		data += BLOCK_DATA_SIZE;
		len -= BLOCK_DATA_SIZE;
	} while (1);
}